

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O3

bool __thiscall directed_graph_t::add_edge(directed_graph_t *this,vertex_index_t v,vertex_index_t w)

{
  pointer puVar1;
  ulong *puVar2;
  ulong uVar3;
  unsigned_short *puVar4;
  ulong uVar5;
  logic_error *this_00;
  long *plVar6;
  size_type *psVar7;
  long *plVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  iterator iVar12;
  ulong uVar13;
  ushort uVar14;
  uint __val;
  ulong uVar15;
  ushort local_104;
  ushort local_102;
  ulong local_100;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar13 = (ulong)w;
  uVar15 = (ulong)v;
  do {
    uVar11 = uVar15;
    uVar15 = uVar13;
    uVar10 = (ushort)uVar11;
    uVar14 = (ushort)uVar15;
    __val = (uint)uVar15;
    if (uVar10 <= uVar14) break;
    uVar13 = uVar11;
  } while (this->directed == false);
  local_104 = uVar14;
  local_102 = uVar10;
  if ((uVar10 < this->number_of_vertices) && (uVar14 < this->number_of_vertices)) {
    uVar3 = uVar15 >> 6;
    uVar13 = (this->incidence_outgoing).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[this->incidence_row_length * uVar11 + uVar3];
    uVar9 = 1L << (sbyte)(__val & 0xffff003f);
    if ((uVar13 >> (__val & 0xffff003f) & 1) == 0) {
      puVar1 = (this->outdegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar11;
      *puVar1 = *puVar1 + 1;
      puVar1 = (this->indegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar15;
      *puVar1 = *puVar1 + 1;
      local_f8 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&this->edges;
      iVar12._M_current =
           (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
           .super__Vector_impl_data._M_finish;
      puVar4 = (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar12._M_current == puVar4) {
        local_100 = uVar13;
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>(local_f8,iVar12,&local_102);
        iVar12._M_current =
             (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        puVar4 = (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        uVar13 = local_100;
      }
      else {
        *iVar12._M_current = uVar10;
        iVar12._M_current = iVar12._M_current + 1;
        (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar12._M_current;
      }
      if (iVar12._M_current == puVar4) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>(local_f8,iVar12,&local_104);
        uVar15 = (ulong)local_104;
        uVar5 = 1L << ((byte)local_104 & 0x3f);
      }
      else {
        *iVar12._M_current = uVar14;
        (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        uVar5 = uVar9;
      }
      puVar2 = (this->incidence_outgoing).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start +
               this->incidence_row_length * (ulong)local_102 + uVar3;
      *puVar2 = *puVar2 | uVar5;
      puVar2 = (this->incidence_incoming).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start +
               uVar15 * this->incidence_row_length + (uVar11 >> 6);
      *puVar2 = *puVar2 | 1L << ((byte)local_102 & 0x3f);
    }
    return (uVar13 & uVar9) == 0;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  if (uVar14 < uVar10) {
    __val = (uint)uVar11;
  }
  std::__cxx11::to_string(&local_d0,__val);
  std::operator+(&local_70,"Out of bounds, tried to add an edge involving vertex ",&local_d0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar7) {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0.field_2._8_8_ = plVar6[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar7;
  }
  local_f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::to_string(&local_90,(uint)this->number_of_vertices);
  std::operator+(&local_50,&local_f0,&local_90);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar6;
  plVar8 = plVar6 + 2;
  if (local_b0 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_b0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool add_edge(vertex_index_t v, vertex_index_t w) {
		if (!directed && v > w) return add_edge(w, v);

		if (v >= number_of_vertices || w >= number_of_vertices)
			throw std::logic_error("Out of bounds, tried to add an edge involving vertex " +
			                       std::to_string(std::max(v, w)) + ", but there are only " +
			                       std::to_string(number_of_vertices) + " vertices.");

		const size_t vv = v >> 6;
		const size_t ww = w >> 6;

		// Prevent multiple insertions
		if (incidence_outgoing[v * incidence_row_length + ww] & (ONE_ << ((w - (ww << 6))))) return false;

		outdegrees[v]++;
		indegrees[w]++;
		edges.push_back(v);
		edges.push_back(w);

		incidence_outgoing[v * incidence_row_length + ww] |= ONE_ << ((w - (ww << 6)));

		incidence_incoming[w * incidence_row_length + vv] |= ONE_ << (v - (vv << 6));
		return true;
	}